

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_copy_function_info.cpp
# Opt level: O1

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateCopyFunctionInfo::Copy(CreateCopyFunctionInfo *this)

{
  CreateCopyFunctionInfo *this_00;
  type other;
  pointer *__ptr;
  CreateInfo *in_RSI;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::CreateCopyFunctionInfo_*,_false> local_2d8;
  CopyFunction local_2d0;
  
  this_00 = (CreateCopyFunctionInfo *)operator_new(0x3f8);
  CopyFunction::CopyFunction(&local_2d0,(CopyFunction *)&in_RSI[1].catalog.field_2);
  CreateCopyFunctionInfo(this_00,&local_2d0);
  local_2d0.super_Function._vptr_Function = (_func_int **)&PTR__CopyFunction_0247f8f8;
  local_2d8._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.extension._M_dataplus._M_p != &local_2d0.extension.field_2) {
    operator_delete(local_2d0.extension._M_dataplus._M_p);
  }
  local_2d0.copy_from_function.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_0247c898;
  if (local_2d0.copy_from_function.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.copy_from_function.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_2d0.copy_from_function.super_SimpleNamedParameterFunction);
  Function::~Function(&local_2d0.super_Function);
  other = unique_ptr<duckdb::CreateCopyFunctionInfo,_std::default_delete<duckdb::CreateCopyFunctionInfo>,_true>
          ::operator*((unique_ptr<duckdb::CreateCopyFunctionInfo,_std::default_delete<duckdb::CreateCopyFunctionInfo>,_true>
                       *)&local_2d8);
  CreateInfo::CopyProperties(in_RSI,&other->super_CreateInfo);
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_2d8._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateCopyFunctionInfo::Copy() const {
	auto result = make_uniq<CreateCopyFunctionInfo>(function);
	CopyProperties(*result);
	return std::move(result);
}